

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

string * __thiscall
boost::deflate::inflate_stream_test::check_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,IDecompressor *d,
          initializer_list<unsigned_char> *in,error_code expected,wrap wrap,size_t window_size,
          size_t len)

{
  runner *this_00;
  initializer_list<unsigned_char> *piVar1;
  bool bVar2;
  const_iterator puVar3;
  undefined8 uVar4;
  unsigned_long *puVar5;
  long lVar6;
  runner **pprVar7;
  undefined1 auVar8 [16];
  undefined3 in_stack_00000009;
  byte local_c9;
  unsigned_long local_80;
  unsigned_long local_78;
  unsigned_long n;
  undefined8 uStack_68;
  size_type local_60;
  undefined1 auStack_58 [8];
  error_code ec;
  allocator<char> local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<unsigned_char> *piStack_30;
  wrap wrap_local;
  initializer_list<unsigned_char> *in_local;
  IDecompressor *d_local;
  error_code expected_local;
  string *out;
  
  expected_local._0_8_ = expected._0_8_;
  local_31 = expected.cat_._0_1_;
  local_32 = 0;
  piStack_30 = (initializer_list<unsigned_char> *)d;
  in_local = (initializer_list<unsigned_char> *)this;
  d_local = (IDecompressor *)in;
  expected_local.cat_ = (error_category *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,0x400,'\0',&local_33);
  std::allocator<char>::~allocator(&local_33);
  (**(code **)(in_local->_M_array + 8))(in_local,_wrap,local_31);
  system::error_code::error_code((error_code *)auStack_58);
  piVar1 = in_local;
  puVar3 = std::initializer_list<unsigned_char>::begin(piStack_30);
  (**(code **)(piVar1->_M_array + 0x28))(piVar1,puVar3);
  piVar1 = in_local;
  uVar4 = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  (**(code **)(piVar1->_M_array + 0x48))(piVar1,uVar4);
  piVar1 = in_local;
  local_60 = std::initializer_list<unsigned_char>::size(piStack_30);
  puVar5 = std::min<unsigned_long>(&local_60,&window_size);
  (**(code **)(piVar1->_M_array + 0x18))(piVar1,*puVar5);
  piVar1 = in_local;
  uVar4 = std::__cxx11::string::size();
  (**(code **)(piVar1->_M_array + 0x38))(piVar1,uVar4);
  while( true ) {
    lVar6 = (**(code **)(in_local->_M_array + 0x10))();
    local_c9 = 0;
    if (lVar6 != 0) {
      bVar2 = system::error_code::operator_cast_to_bool((error_code *)auStack_58);
      local_c9 = bVar2 ^ 0xff;
    }
    if ((local_c9 & 1) == 0) break;
    auVar8 = (**(code **)(in_local->_M_array + 0x50))(in_local,3);
    n._0_4_ = auVar8._0_4_;
    n._4_4_ = auVar8._4_4_;
    uStack_68._0_4_ = auVar8._8_4_;
    uStack_68._4_4_ = auVar8._12_4_;
    auStack_58._0_4_ = (int)n;
    auStack_58._4_4_ = n._4_4_;
    ec.val_ = (int)uStack_68;
    ec.failed_ = uStack_68._4_1_;
    ec._5_3_ = uStack_68._5_3_;
    n = auVar8._0_8_;
    uStack_68 = auVar8._8_8_;
    local_80 = (**(code **)(in_local->_M_array + 0x10))();
    puVar5 = std::min<unsigned_long>(&local_80,&window_size);
    piVar1 = in_local;
    local_78 = *puVar5;
    lVar6 = (**(code **)(in_local->_M_array + 0x20))();
    (**(code **)(piVar1->_M_array + 0x28))(piVar1,lVar6 + local_78);
    piVar1 = in_local;
    lVar6 = (**(code **)(in_local->_M_array + 0x10))();
    (**(code **)(piVar1->_M_array + 0x18))(piVar1,lVar6 - local_78);
  }
  pprVar7 = test_suite::detail::current();
  this_00 = *pprVar7;
  bVar2 = system::operator==((error_code *)auStack_58,(error_code *)&d_local);
  test_suite::detail::runner::maybe_fail<bool>
            (this_00,bVar2,"ec == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x23c,
             "static std::string boost::deflate::inflate_stream_test::check(IDecompressor &, const std::initializer_list<std::uint8_t> &, error_code, wrap, std::size_t, std::size_t)"
             ,(char *)0x0);
  return __return_storage_ptr__;
}

Assistant:

static
    std::string check(IDecompressor& d,
                      std::initializer_list<std::uint8_t> const& in,
                      error_code expected,
                      wrap wrap =boost::deflate::wrap::none,
                      std::size_t window_size = 15,
                      std::size_t len = -1)
    {
        std::string out(1024, 0);
        d.init(static_cast<int>(window_size), wrap);
        error_code ec;

        d.next_in(&*in.begin());
        d.next_out(&out[0]);
        d.avail_in(std::min(in.size(), len));
        d.avail_out(out.size());

        while (d.avail_in() > 0 && !ec)
        {
            ec = d.write(Flush::sync);
            auto n = std::min(d.avail_in(), len);
            d.next_in(static_cast<char const*>(d.next_in()) + n);
            d.avail_in(d.avail_in() - n);
        }

        BOOST_TEST(ec == expected);
        return out;
    }